

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_open_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  undefined4 local_4;
  
  if (in_RCX == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RCX = 0;
    if ((in_RSI == 0) || (in_EDX == 0)) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      local_4 = ma_default_vfs_open_w__stdio(pVFS,pFilePath,openMode,pFile);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_default_vfs_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_open_w__win32(pVFS, pFilePath, openMode, pFile);
#else
    return ma_default_vfs_open_w__stdio(pVFS, pFilePath, openMode, pFile);
#endif
}